

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O2

void al_color_yuv_to_rgb(float y,float u,float v,float *red,float *green,float *blue)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined4 in_EAX;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar2 = (u + u + -1.0) * 0.436;
  fVar6 = (v + v + -1.0) * 0.615;
  fVar7 = fVar2 * 2.03211 + y;
  fVar2 = fVar6 * -0.5806 + fVar2 * -0.39465 + y;
  auVar1._8_4_ = (int)-(ulong)(fVar2 < 0.0);
  auVar1._0_8_ = -(ulong)(fVar7 < 0.0);
  auVar1._12_4_ = (int)(-(ulong)(fVar2 < 0.0) >> 0x20);
  uVar3 = movmskpd(in_EAX,auVar1);
  fVar4 = 1.0;
  if (fVar7 <= 1.0) {
    fVar4 = 0.0;
  }
  if ((uVar3 & 1) == 0) {
    fVar4 = 1.0;
  }
  fVar5 = fVar4;
  if (fVar7 <= 1.0) {
    fVar5 = fVar7;
  }
  if ((uVar3 & 1) == 0) {
    fVar4 = fVar5;
  }
  fVar7 = 1.0;
  if (fVar2 <= 1.0) {
    fVar7 = 0.0;
  }
  if ((uVar3 & 2) == 0) {
    fVar7 = 1.0;
  }
  fVar5 = fVar7;
  if (fVar2 <= 1.0) {
    fVar5 = fVar2;
  }
  fVar2 = fVar6 * 1.13983 + y;
  if ((uVar3 & 2) == 0) {
    fVar7 = fVar5;
  }
  fVar6 = 1.0;
  if (fVar2 <= 1.0) {
    fVar6 = 0.0;
  }
  if (0.0 <= fVar2) {
    fVar6 = 1.0;
  }
  fVar5 = fVar6;
  if (fVar2 <= 1.0) {
    fVar5 = fVar2;
  }
  if (0.0 <= fVar2) {
    fVar6 = fVar5;
  }
  *red = fVar6;
  *green = fVar7;
  *blue = fVar4;
  return;
}

Assistant:

void al_color_yuv_to_rgb(float y, float u, float v,
    float *red, float *green, float *blue)
{
   /* Translate range 0..1 to actual range. */
   u = 0.436 * (u * 2 - 1);
   v = 0.615 * (v * 2 - 1);
   *red = _ALLEGRO_CLAMP(0, 1, y + v * 1.13983);
   *green = _ALLEGRO_CLAMP(0, 1, y + u * -0.39465 + v * -0.58060);
   *blue = _ALLEGRO_CLAMP(0, 1, y + u * 2.03211);
}